

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void repeat_low_4pixels(__m128i *x,__m128i *row)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  longlong local_d8;
  longlong local_c8;
  longlong local_b8;
  longlong local_a8;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  __m128i *row_local;
  __m128i *x_local;
  
  auVar1 = pshuflw((undefined1  [16])*x,(undefined1  [16])*x,0);
  auVar2 = pshuflw((undefined1  [16])*x,(undefined1  [16])*x,0x55);
  auVar3 = pshuflw((undefined1  [16])*x,(undefined1  [16])*x,0xaa);
  auVar4 = pshuflw((undefined1  [16])*x,(undefined1  [16])*x,0xff);
  local_a8 = auVar1._0_8_;
  (*row)[0] = local_a8;
  (*row)[1] = local_a8;
  local_b8 = auVar2._0_8_;
  row[1][0] = local_b8;
  row[1][1] = local_b8;
  local_c8 = auVar3._0_8_;
  row[2][0] = local_c8;
  row[2][1] = local_c8;
  local_d8 = auVar4._0_8_;
  row[3][0] = local_d8;
  row[3][1] = local_d8;
  return;
}

Assistant:

static inline void repeat_low_4pixels(const __m128i *x, __m128i *row) {
  const __m128i u0 = _mm_shufflelo_epi16(*x, 0);
  const __m128i u1 = _mm_shufflelo_epi16(*x, 0x55);
  const __m128i u2 = _mm_shufflelo_epi16(*x, 0xaa);
  const __m128i u3 = _mm_shufflelo_epi16(*x, 0xff);

  row[0] = _mm_unpacklo_epi64(u0, u0);
  row[1] = _mm_unpacklo_epi64(u1, u1);
  row[2] = _mm_unpacklo_epi64(u2, u2);
  row[3] = _mm_unpacklo_epi64(u3, u3);
}